

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O3

void af_glyph_hints_done(AF_GlyphHints hints)

{
  FT_Memory memory;
  AF_Edge_conflict P;
  bool bVar1;
  AF_AxisHintsRec *pAVar2;
  long lVar3;
  bool bVar4;
  
  if ((hints != (AF_GlyphHints)0x0) && (memory = hints->memory, memory != (FT_Memory)0x0)) {
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      pAVar2 = hints->axis + lVar3;
      pAVar2->num_segments = 0;
      pAVar2->max_segments = 0;
      if ((anon_struct_2496_2_23da31ad_for_embedded *)pAVar2->segments != &pAVar2->embedded) {
        ft_mem_free(memory,pAVar2->segments);
        hints->axis[lVar3].segments = (AF_Segment_conflict)0x0;
      }
      hints->axis[lVar3].num_edges = 0;
      hints->axis[lVar3].max_edges = 0;
      P = hints->axis[lVar3].edges;
      if (P != hints->axis[lVar3].embedded.edges) {
        ft_mem_free(memory,P);
        hints->axis[lVar3].edges = (AF_Edge_conflict)0x0;
      }
      lVar3 = 1;
      bVar1 = false;
    } while (bVar4);
    if ((anon_struct_7744_2_b586ae8f_for_embedded *)hints->contours != &hints->embedded) {
      ft_mem_free(memory,hints->contours);
      hints->contours = (AF_Point_conflict *)0x0;
    }
    hints->max_contours = 0;
    hints->num_contours = 0;
    if (hints->points != (hints->embedded).points) {
      ft_mem_free(memory,hints->points);
      hints->points = (AF_Point_conflict)0x0;
    }
    hints->max_points = 0;
    hints->num_points = 0;
    hints->memory = (FT_Memory)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_done( AF_GlyphHints  hints )
  {
    FT_Memory  memory;
    int        dim;


    if ( !( hints && hints->memory ) )
      return;

    memory = hints->memory;

    /*
     *  note that we don't need to free the segment and edge
     *  buffers since they are really within the hints->points array
     */
    for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
    {
      AF_AxisHints  axis = &hints->axis[dim];


      axis->num_segments = 0;
      axis->max_segments = 0;
      if ( axis->segments != axis->embedded.segments )
        FT_FREE( axis->segments );

      axis->num_edges = 0;
      axis->max_edges = 0;
      if ( axis->edges != axis->embedded.edges )
        FT_FREE( axis->edges );
    }

    if ( hints->contours != hints->embedded.contours )
      FT_FREE( hints->contours );
    hints->max_contours = 0;
    hints->num_contours = 0;

    if ( hints->points != hints->embedded.points )
      FT_FREE( hints->points );
    hints->max_points = 0;
    hints->num_points = 0;

    hints->memory = NULL;
  }